

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O3

void sys_get_audio_settings(t_audiosettings *a)

{
  long lVar1;
  t_audiosettings *ptVar2;
  
  if (initted == '\0') {
    audio_nextsettings.a_api = 9;
    audio_nextsettings.a_nindev = 1;
    audio_nextsettings.a_srate = 0xac44;
    audio_nextsettings.a_advance = 0x19;
    audio_nextsettings.a_nchoutdev = 1;
    audio_nextsettings.a_choutdevvec[0] = 2;
    audio_nextsettings.a_noutdev = 1;
    audio_nextsettings.a_outdevvec[0] = 0;
    audio_nextsettings.a_nchindev = 1;
    audio_nextsettings.a_chindevvec[0] = 2;
    audio_nextsettings.a_indevvec[0] = 0;
    audio_nextsettings.a_blocksize = 0x40;
    initted = '\x01';
  }
  ptVar2 = &audio_nextsettings;
  for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
    a->a_api = ptVar2->a_api;
    ptVar2 = (t_audiosettings *)&ptVar2->a_nindev;
    a = (t_audiosettings *)&a->a_nindev;
  }
  return;
}

Assistant:

void sys_get_audio_settings(t_audiosettings *a)
{
    if (!initted)
    {
        audio_nextsettings.a_api = API_DEFAULT;
        audio_nextsettings.a_srate = DEFAULTSRATE;
        audio_nextsettings.a_nindev = audio_nextsettings.a_nchindev =
            audio_nextsettings.a_noutdev = audio_nextsettings.a_nchoutdev
                = 1;
        audio_nextsettings.a_indevvec[0] =
            audio_nextsettings.a_outdevvec[0] = DEFAULTAUDIODEV;
        audio_nextsettings.a_chindevvec[0] =
            audio_nextsettings.a_choutdevvec[0] = SYS_DEFAULTCH;
        audio_nextsettings.a_advance = DEFAULTADVANCE;
        audio_nextsettings.a_blocksize = DEFDACBLKSIZE;
        initted = 1;
    }
    *a = audio_nextsettings;
    if (audio_isfixedsr(a->a_api))
        a->a_srate = STUFF->st_dacsr;
    if (audio_isfixedblocksize(a->a_api))
        a->a_blocksize = audio_getfixedblocksize(a->a_api);
}